

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMini.c
# Opt level: O1

void Gia_ManNameMapVerify
               (Gia_Man_t *p,Gia_Man_t *p1,Gia_Man_t *p2,Vec_Int_t *vMap1,Vec_Int_t *vMap2,int *pMap
               )

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  Gia_Obj_t *pGVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  
  iVar2 = vMap2->nSize;
  Gia_ManSetPhase(p1);
  Gia_ManSetPhase(p2);
  if (0 < (long)iVar2) {
    uVar10 = 0;
    do {
      uVar3 = pMap[uVar10];
      if (-1 < (int)uVar3) {
        uVar12 = uVar3 >> 1;
        if ((vMap1->nSize <= (int)uVar12) || ((long)vMap2->nSize <= (long)uVar10)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar4 = vMap1->pArray[uVar12];
        if ((int)uVar4 < 0) goto LAB_0077855d;
        uVar8 = uVar4 >> 1;
        if (p1->nObjs <= (int)uVar8) {
LAB_0077857c:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        uVar5 = *(uint *)(p1->pObjs + uVar8);
        if (-1 < (int)uVar5 || (~uVar5 & 0x1fffffff) == 0) {
          pGVar1 = p1->pObjs + uVar8;
          uVar8 = pGVar1->Value;
          if (uVar8 != 0xffffffff) {
            uVar5 = vMap2->pArray[uVar10];
            if ((int)uVar5 < 0) {
LAB_0077855d:
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x12f,"int Abc_Lit2Var(int)");
            }
            uVar9 = uVar5 >> 1;
            if (p2->nObjs <= (int)uVar9) goto LAB_0077857c;
            pGVar7 = p2->pObjs;
            uVar6 = pGVar7[uVar9].Value;
            if (uVar6 != 0xffffffff) {
              if (((int)uVar8 < 0) || ((int)uVar6 < 0)) goto LAB_0077855d;
              uVar11 = (uint)p->pReprs[uVar8 >> 1] & 0xfffffff;
              if (uVar11 == 0xfffffff) {
                uVar11 = uVar8 >> 1;
              }
              uVar8 = (uint)p->pReprs[uVar6 >> 1] & 0xfffffff;
              if (uVar8 == 0xfffffff) {
                uVar8 = uVar6 >> 1;
              }
              if (uVar11 != uVar8) {
                printf("Found functional mismatch for LutId %d and AigId %d.\n",uVar10 & 0xffffffff,
                       (ulong)uVar12);
              }
              if ((uVar5 & 1 ^ (uint)((ulong)*(undefined8 *)(pGVar7 + uVar9) >> 0x3f)) !=
                  ((uVar3 ^ uVar4) & 1 ^ (uint)((ulong)*(undefined8 *)pGVar1 >> 0x3f))) {
                printf("Found phase mismatch for LutId %d and AigId %d.\n",uVar10 & 0xffffffff,
                       (ulong)uVar12);
              }
            }
          }
        }
      }
      uVar10 = uVar10 + 1;
    } while ((long)iVar2 != uVar10);
  }
  return;
}

Assistant:

void Gia_ManNameMapVerify( Gia_Man_t * p, Gia_Man_t * p1, Gia_Man_t * p2, Vec_Int_t * vMap1, Vec_Int_t * vMap2, int * pMap )
{
    int iLut, iObj1, iObj2, nSize = Vec_IntSize(vMap2);
    Gia_Obj_t * pObjAig, * pObjLut;
    Gia_ManSetPhase( p1 );
    Gia_ManSetPhase( p2 );
    for ( iLut = 0; iLut < nSize; iLut++ )
        if ( pMap[iLut] >= 0 )
        {
            int iObj   = Abc_Lit2Var( pMap[iLut] );
            int fCompl = Abc_LitIsCompl( pMap[iLut] );
            int iLitAig = Vec_IntEntry( vMap1, iObj );
            int iLitLut = Vec_IntEntry( vMap2, iLut );
            pObjAig = Gia_ManObj( p1, Abc_Lit2Var(iLitAig) );
            if ( Gia_ObjIsCo(pObjAig) )
                continue;
            if ( ~pObjAig->Value == 0 )
                continue;
            pObjLut = Gia_ManObj( p2, Abc_Lit2Var(iLitLut) );
            if ( ~pObjLut->Value == 0 )
                continue;
            iObj1 = Gia_ObjReprSelf(p, Abc_Lit2Var(pObjAig->Value));
            iObj2 = Gia_ObjReprSelf(p, Abc_Lit2Var(pObjLut->Value));
            if ( iObj1 != iObj2 )
                printf( "Found functional mismatch for LutId %d and AigId %d.\n", iLut, iObj );
            if ( (pObjLut->fPhase ^ Abc_LitIsCompl(iLitLut)) != (pObjAig->fPhase ^ Abc_LitIsCompl(iLitAig) ^ fCompl) )
                printf( "Found phase mismatch for LutId %d and AigId %d.\n", iLut, iObj );
        }
}